

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,string *filename)

{
  bool bVar1;
  bool bVar2;
  string *in_base;
  cmMessenger *messenger;
  cmListFile listFile;
  ListFileScope scope;
  string filenametoread;
  cmListFile local_68;
  ListFileScope local_50;
  string local_40;
  
  in_base = GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath(&local_40,filename,in_base);
  ListFileScope::ListFileScope(&local_50,this,&local_40);
  local_68.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile(&local_68,local_40._M_dataplus._M_p,messenger,&this->Backtrace);
  if (bVar1) {
    ReadListFile(this,&local_68,&local_40);
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    if (bVar2) {
      local_50.ReportError = false;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_68.Functions)
  ;
  ListFileScope::~ListFileScope(&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadListFile(const std::string& filename)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }
  return true;
}